

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_150d035::Toolchains::DumpToolchainVariable
          (Toolchains *this,cmMakefile *mf,Value *object,string *lang,ToolchainVariable *variable)

{
  pointer pbVar1;
  bool bVar2;
  cmValue value;
  Value *pVVar3;
  pointer value_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  Value jsonArray;
  string variableName;
  ValueHolder local_60;
  ValueHolder local_58;
  
  jsonArray.value_.int_ = 6;
  jsonArray._8_8_ = (long)"The CMAKE_" + 4;
  local_58 = object->value_;
  local_60 = *(ValueHolder *)&object->bits_;
  cmStrCat<char[2],std::__cxx11::string>
            (&variableName,(cmAlphaNum *)&jsonArray,(cmAlphaNum *)&local_60,(char (*) [2])0x680647,
             lang + 1);
  if (*(char *)&lang[2]._M_dataplus._M_p == '\x01') {
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = cmMakefile::GetDefExpandList((cmMakefile *)this,&variableName,&values,false);
    if (bVar2) {
      Json::Value::Value(&jsonArray,arrayValue);
      pbVar1 = values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (value_00 = values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; value_00 != pbVar1;
          value_00 = value_00 + 1) {
        Json::Value::Value((Value *)&local_60,value_00);
        Json::Value::append(&jsonArray,(Value *)&local_60);
        Json::Value::~Value((Value *)&local_60);
      }
      pVVar3 = Json::Value::operator[]((Value *)mf,lang);
      Json::Value::operator=(pVVar3,&jsonArray);
      Json::Value::~Value(&jsonArray);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&values);
  }
  else {
    value = cmMakefile::GetDefinition((cmMakefile *)this,&variableName);
    if (value.Value != (string *)0x0) {
      Json::Value::Value(&jsonArray,value.Value);
      pVVar3 = Json::Value::operator[]((Value *)mf,lang);
      Json::Value::operator=(pVVar3,&jsonArray);
      Json::Value::~Value(&jsonArray);
    }
  }
  std::__cxx11::string::~string((string *)&variableName);
  return;
}

Assistant:

void Toolchains::DumpToolchainVariable(cmMakefile const* mf,
                                       Json::Value& object,
                                       std::string const& lang,
                                       ToolchainVariable const& variable)
{
  std::string const variableName =
    cmStrCat("CMAKE_", lang, "_", variable.VariableSuffix);

  if (variable.IsList) {
    std::vector<std::string> values;
    if (mf->GetDefExpandList(variableName, values)) {
      Json::Value jsonArray = Json::arrayValue;
      for (std::string const& value : values) {
        jsonArray.append(value);
      }
      object[variable.ObjectKey] = jsonArray;
    }
  } else {
    cmValue def = mf->GetDefinition(variableName);
    if (def) {
      object[variable.ObjectKey] = *def;
    }
  }
}